

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::skippedString(XMLReader *this,XMLCh *toSkip)

{
  short *psVar1;
  XMLSize_t XVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  if (toSkip != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toSkip + uVar7);
      uVar7 = uVar7 + 2;
    } while (*psVar1 != 0);
    uVar7 = ((long)uVar7 >> 1) - 1;
  }
  XVar2 = this->fCharIndex;
  uVar3 = this->fCharsAvail - XVar2;
  while( true ) {
    if (uVar7 <= uVar3) {
      iVar5 = bcmp(this->fCharBuf + XVar2,toSkip,uVar7 * 2);
      if (iVar5 != 0) {
        return false;
      }
      this->fCurCol = this->fCurCol + uVar7;
      this->fCharIndex = XVar2 + uVar7;
      return true;
    }
    bVar4 = refreshCharBuffer(this);
    if (!bVar4) break;
    XVar2 = this->fCharIndex;
    uVar6 = this->fCharsAvail - XVar2;
    bVar4 = uVar6 == uVar3;
    uVar3 = uVar6;
    if (bVar4) {
      return false;
    }
  }
  return false;
}

Assistant:

bool XMLReader::skippedString(const XMLCh* const toSkip)
{
    // This function works on strings that are smaller than kCharBufSize.
    // This function guarantees that in case the comparison is unsuccessful
    // the fCharIndex will point to the original data.
    //

    // Get the length of the string to skip.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    while (charsLeft < srcLen)
    {
      if (!refreshCharBuffer())
        return false;

      XMLSize_t tmp = charsLeftInBuffer();
      if (tmp == charsLeft) // if the refreshCharBuf() did not add anything new
        return false;     // give up and return.

      charsLeft = tmp;
    }

    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toSkip, srcLen * sizeof(XMLCh)))
      return false;

    // Add the source length to the current column to get it back right.
    //
    fCurCol += (XMLFileLoc)srcLen;

    //  And get the character buffer index back right by just adding the
    //  source len to it.
    //
    fCharIndex += srcLen;

    return true;
}